

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O3

void duckdb::TupleDataAllocator::RecomputeHeapPointers
               (Vector *old_heap_ptrs,SelectionVector *old_heap_sel,data_ptr_t *row_locations,
               Vector *new_heap_ptrs,idx_t offset,idx_t count,TupleDataLayout *layout,
               idx_t base_col_offset)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  value_type vVar3;
  data_ptr_t pdVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TupleDataLayout>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  iterator iVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong __n;
  ulong local_98;
  SelectionVector new_heap_sel;
  UnifiedVectorFormat new_heap_data;
  
  pdVar2 = old_heap_ptrs->data;
  UnifiedVectorFormat::UnifiedVectorFormat(&new_heap_data);
  Vector::ToUnifiedFormat(new_heap_ptrs,count + offset,&new_heap_data);
  new_heap_sel.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  new_heap_sel.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  shared_ptr<duckdb::SelectionData,_true>::operator=
            (&new_heap_sel.selection_data,&(new_heap_data.sel)->selection_data);
  new_heap_sel.sel_vector = (new_heap_data.sel)->sel_vector;
  if ((layout->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (layout->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar5 = vector<unsigned_long,_true>::operator[](&layout->offsets,__n);
      pvVar6 = vector<duckdb::LogicalType,_true>::operator[](&layout->types,__n);
      PVar1 = pvVar6->physical_type_;
      if (PVar1 < ARRAY) {
        if (PVar1 == LIST) {
LAB_012d79ed:
          if (count != 0) {
            iVar8 = offset;
            iVar9 = count;
            do {
              pdVar4 = row_locations[iVar8];
              if ((1 << ((byte)__n & 7) & (uint)pdVar4[(__n >> 3) + base_col_offset]) != 0) {
                iVar10 = iVar8;
                if (old_heap_sel->sel_vector != (sel_t *)0x0) {
                  iVar10 = (idx_t)old_heap_sel->sel_vector[iVar8];
                }
                iVar11 = iVar8;
                if (new_heap_sel.sel_vector != (sel_t *)0x0) {
                  iVar11 = (idx_t)new_heap_sel.sel_vector[iVar8];
                }
                *(long *)(pdVar4 + *pvVar5 + base_col_offset) =
                     (*(long *)(pdVar4 + *pvVar5 + base_col_offset) - *(long *)(pdVar2 + iVar10 * 8)
                     ) + *(long *)(new_heap_data.data + iVar11 * 8);
              }
              iVar8 = iVar8 + 1;
              iVar9 = iVar9 - 1;
            } while (iVar9 != 0);
          }
        }
        else if (PVar1 == STRUCT) {
          local_98 = __n;
          this = &unique_ptr<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>,_true>
                  ::operator->(&layout->struct_layouts)->_M_h;
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TupleDataLayout>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this,&local_98);
          if (*(char *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>,_false>
                              ._M_cur + 0x80) == '\0') {
            RecomputeHeapPointers
                      (old_heap_ptrs,old_heap_sel,row_locations,new_heap_ptrs,offset,count,
                       (TupleDataLayout *)
                       ((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>,_false>
                              ._M_cur + 0x10),*pvVar5 + base_col_offset);
          }
        }
      }
      else {
        if (PVar1 == ARRAY) goto LAB_012d79ed;
        if ((PVar1 == VARCHAR) && (count != 0)) {
          iVar8 = offset;
          iVar9 = count;
          do {
            pdVar4 = row_locations[iVar8];
            if ((1 << ((byte)__n & 7) & (uint)pdVar4[(__n >> 3) + base_col_offset]) != 0) {
              iVar10 = iVar8;
              if (old_heap_sel->sel_vector != (sel_t *)0x0) {
                iVar10 = (idx_t)old_heap_sel->sel_vector[iVar8];
              }
              iVar11 = iVar8;
              if (new_heap_sel.sel_vector != (sel_t *)0x0) {
                iVar11 = (idx_t)new_heap_sel.sel_vector[iVar8];
              }
              vVar3 = *pvVar5;
              if (0xc < *(uint *)(pdVar4 + vVar3 + base_col_offset)) {
                *(long *)(pdVar4 + vVar3 + base_col_offset + 8) =
                     (*(long *)(pdVar4 + vVar3 + base_col_offset + 8) -
                     *(long *)(pdVar2 + iVar10 * 8)) + *(long *)(new_heap_data.data + iVar11 * 8);
              }
            }
            iVar8 = iVar8 + 1;
            iVar9 = iVar9 - 1;
          } while (iVar9 != 0);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(layout->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(layout->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  if (new_heap_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (new_heap_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (new_heap_data.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (new_heap_data.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (new_heap_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (new_heap_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
               internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void TupleDataAllocator::RecomputeHeapPointers(Vector &old_heap_ptrs, const SelectionVector &old_heap_sel,
                                               const data_ptr_t row_locations[], Vector &new_heap_ptrs,
                                               const idx_t offset, const idx_t count, const TupleDataLayout &layout,
                                               const idx_t base_col_offset) {
	const auto old_heap_locations = FlatVector::GetData<data_ptr_t>(old_heap_ptrs);

	UnifiedVectorFormat new_heap_data;
	new_heap_ptrs.ToUnifiedFormat(offset + count, new_heap_data);
	const auto new_heap_locations = UnifiedVectorFormat::GetData<data_ptr_t>(new_heap_data);
	const auto new_heap_sel = *new_heap_data.sel;

	for (idx_t col_idx = 0; col_idx < layout.ColumnCount(); col_idx++) {
		const auto &col_offset = layout.GetOffsets()[col_idx];

		// Precompute mask indexes
		idx_t entry_idx;
		idx_t idx_in_entry;
		ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

		const auto &type = layout.GetTypes()[col_idx];
		switch (type.InternalType()) {
		case PhysicalType::VARCHAR: {
			for (idx_t i = 0; i < count; i++) {
				const auto idx = offset + i;
				const auto &row_location = row_locations[idx] + base_col_offset;
				ValidityBytes row_mask(row_location, layout.ColumnCount());
				if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
					continue;
				}

				const auto &old_heap_ptr = old_heap_locations[old_heap_sel.get_index(idx)];
				const auto &new_heap_ptr = new_heap_locations[new_heap_sel.get_index(idx)];

				const auto string_location = row_location + col_offset;
				if (Load<uint32_t>(string_location) > string_t::INLINE_LENGTH) {
					const auto string_ptr_location = string_location + string_t::HEADER_SIZE;
					const auto string_ptr = Load<data_ptr_t>(string_ptr_location);
					const auto diff = string_ptr - old_heap_ptr;
					D_ASSERT(diff >= 0);
					Store<data_ptr_t>(new_heap_ptr + diff, string_ptr_location);
				}
			}
			VerifyStrings(layout, type.id(), row_locations, col_idx, base_col_offset, col_offset, offset, count);
			break;
		}
		case PhysicalType::LIST:
		case PhysicalType::ARRAY: {
			for (idx_t i = 0; i < count; i++) {
				const auto idx = offset + i;
				const auto &row_location = row_locations[idx] + base_col_offset;
				ValidityBytes row_mask(row_location, layout.ColumnCount());
				if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
					continue;
				}

				const auto &old_heap_ptr = old_heap_locations[old_heap_sel.get_index(idx)];
				const auto &new_heap_ptr = new_heap_locations[new_heap_sel.get_index(idx)];

				const auto &list_ptr_location = row_location + col_offset;
				const auto list_ptr = Load<data_ptr_t>(list_ptr_location);
				const auto diff = list_ptr - old_heap_ptr;
				D_ASSERT(diff >= 0);
				Store<data_ptr_t>(new_heap_ptr + diff, list_ptr_location);
			}
			break;
		}
		case PhysicalType::STRUCT: {
			const auto &struct_layout = layout.GetStructLayout(col_idx);
			if (!struct_layout.AllConstant()) {
				RecomputeHeapPointers(old_heap_ptrs, old_heap_sel, row_locations, new_heap_ptrs, offset, count,
				                      struct_layout, base_col_offset + col_offset);
			}
			break;
		}
		default:
			continue;
		}
	}
}